

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getDrho(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  undefined8 local_70;
  
  getFuncflParam((EAMAdapter *)funcflParam.dr);
  FuncflParameters::~FuncflParameters(local_70);
  return (RealType)local_70;
}

Assistant:

RealType EAMAdapter::getDrho() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.drho;
  }